

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O2

void __thiscall Clasp::Asp::PrgAtom::removeDep(PrgAtom *this,Var bodyId,bool pos)

{
  pointer pLVar1;
  Literal *pos_00;
  
  pLVar1 = (this->deps_).ebo_.buf;
  pos_00 = std::__find_if<Clasp::Literal*,__gnu_cxx::__ops::_Iter_equals_val<Clasp::Literal_const>>
                     (pLVar1,pLVar1 + (this->deps_).ebo_.size);
  if (pos_00 != (this->deps_).ebo_.buf + (this->deps_).ebo_.size) {
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::erase(&this->deps_,pos_00);
  }
  return;
}

Assistant:

void PrgAtom::removeDep(Var bodyId, bool pos) {
	LitVec::iterator it = std::find(deps_.begin(), deps_.end(), Literal(bodyId, !pos));
	if (it != deps_.end()) { deps_.erase(it); }
}